

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readChannelsAndLayers.cpp
# Opt level: O0

void readChannels(char *fileName)

{
  bool bVar1;
  int iVar2;
  char *pcVar3;
  InputFile *this;
  char *in_RDI;
  Channel *channelPtr;
  Channel *channel;
  Channel *channel_1;
  ConstIterator i;
  ChannelList *channels;
  InputFile file;
  ConstIterator *in_stack_ffffffffffffff48;
  ConstIterator *in_stack_ffffffffffffff50;
  InputFile local_28 [40];
  
  iVar2 = Imf_3_4::globalThreadCount();
  Imf_3_4::InputFile::InputFile(local_28,in_RDI,iVar2);
  Imf_3_4::InputFile::header();
  pcVar3 = (char *)Imf_3_4::Header::channels();
  Imf_3_4::ChannelList::begin();
  while( true ) {
    Imf_3_4::ChannelList::end();
    bVar1 = Imf_3_4::operator!=(in_stack_ffffffffffffff50,in_stack_ffffffffffffff48);
    if (!bVar1) break;
    Imf_3_4::ChannelList::ConstIterator::channel((ConstIterator *)0x10b7ae);
    Imf_3_4::ChannelList::ConstIterator::operator++(in_stack_ffffffffffffff50);
  }
  this = (InputFile *)Imf_3_4::ChannelList::operator[](pcVar3);
  Imf_3_4::ChannelList::findChannel(pcVar3);
  Imf_3_4::InputFile::~InputFile(this);
  return;
}

Assistant:

void
readChannels(const char fileName[])
{
    InputFile file (fileName);
   
    // [begin useIterator]
    const ChannelList &channels = file.header().channels();

    for (ChannelList::ConstIterator i = channels.begin(); i != channels.end(); ++i)
    {
        const Channel &channel = i.channel();
        // ...
    }
    // [end useIterator]
   
    // [begin directAccess]
    // const ChannelList &channels = file.header().channels();

    const Channel &channel = channels["G"];

    const Channel *channelPtr = channels.findChannel("G");
    // [end directAccess]
    
}